

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

RefCountedPtr<raptor::Status> __thiscall raptor::MakeStatusFromPosixError(raptor *this,char *api)

{
  char *pcVar1;
  int *piVar2;
  char *pcVar3;
  char *local_28;
  char *text;
  char *pcStack_18;
  int err;
  char *api_local;
  RefCountedPtr<raptor::Status> *obj;
  
  pcStack_18 = api;
  api_local = (char *)this;
  piVar2 = __errno_location();
  pcVar1 = pcStack_18;
  text._4_4_ = *piVar2;
  local_28 = (char *)0x0;
  pcVar3 = strerror(text._4_4_);
  raptor_asprintf(&local_28,"%s: %s",pcVar1,pcVar3);
  MakeRefCounted<raptor::Status,int&,char*&>(this,(int *)((long)&text + 4),&local_28);
  Free(local_28);
  return (RefCountedPtr<raptor::Status>)(Status *)this;
}

Assistant:

RefCountedPtr<Status> MakeStatusFromPosixError(const char* api) {
    int err = errno;
    char* text = nullptr;
    raptor_asprintf(&text, "%s: %s", api, strerror(err));
    RefCountedPtr<Status> obj = MakeRefCounted<Status>(err, text);
    raptor::Free(text);
    return obj;
}